

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_speech(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  uint uVar2;
  MOB_INDEX_DATA *mob;
  LINE_DATA *pLVar3;
  LINE_DATA *pLVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  SPEECH_DATA *pSVar8;
  SPEECH_DATA *pSVar9;
  SPEECH_DATA *pSVar10;
  LINE_DATA *pLVar11;
  char buf [4608];
  char name [4608];
  char cmd [4608];
  char arg3 [4608];
  char arg5 [4608];
  char local_5a38 [4608];
  char local_4838 [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    send_to_char("The following speech commands are available:\n\r",ch);
    send_to_char("   speech list\n\r",ch);
    send_to_char("   speech add <speech_name>\n\r",ch);
    send_to_char("   speech del <speech_name>\n\r",ch);
    send_to_char("   speech <speech_name> line add <#delay> <type> <text>\n\r",ch);
    send_to_char("   speech <speech_name> line list\n\r",ch);
    send_to_char("   speech <speech_name> line <#> text <text>\n\r",ch);
    send_to_char("   speech <speech_name> line <#> delay <#>\n\r",ch);
    send_to_char("   speech <speech_name> line <#> type <type>\n\r",ch);
    pcVar7 = "   speech <speech_name> line <#> delete\n\r";
LAB_0035f2a0:
    send_to_char(pcVar7,ch);
    return true;
  }
  mob = (MOB_INDEX_DATA *)ch->desc->pEdit;
  pcVar7 = one_argument(argument,local_3638);
  pcVar7 = one_argument(pcVar7,local_4838);
  pcVar7 = one_argument(pcVar7,local_2438);
  pSVar8 = find_speech(mob,local_3638);
  if (pSVar8 == (SPEECH_DATA *)0x0) {
    bVar5 = str_prefix(local_3638,"list");
    if (bVar5) {
      bVar5 = str_prefix(local_3638,"add");
      if (bVar5) {
        bVar5 = str_prefix(local_3638,"del");
        if (bVar5) {
          bVar5 = str_prefix(local_3638,"edit");
          if (!bVar5) goto LAB_0035f1f8;
          pcVar7 = "Invalid speech command.\n\r";
        }
        else if (local_4838[0] == '\0') {
          pcVar7 = "Delete which speech?\n\r";
        }
        else {
          pSVar8 = find_speech(mob,local_4838);
          if (pSVar8 != (SPEECH_DATA *)0x0) {
            free_speech(pSVar8);
            pcVar7 = "Speech deleted.\n\r";
            goto LAB_0035f2a0;
          }
          pcVar7 = "No speech by that name found.\n\r";
        }
      }
      else {
        if (local_4838[0] != '\0') {
          pSVar9 = new_speech_data();
          pcVar7 = palloc_string(local_4838);
          pSVar9->name = pcVar7;
          pSVar8 = mob->speech;
          if (mob->speech == (SPEECH_DATA *)0x0) {
            mob->speech = pSVar9;
          }
          else {
            do {
              pSVar10 = pSVar8;
              pSVar8 = pSVar10->next;
            } while (pSVar10->next != (SPEECH_DATA *)0x0);
            pSVar10->next = pSVar9;
            pSVar9->prev = pSVar10;
          }
          pcVar7 = "Speech added.\n\r";
          goto LAB_0035f2a0;
        }
        pcVar7 = "You must specify a name for the new speech.\n\r";
      }
    }
    else {
      if (mob->speech != (SPEECH_DATA *)0x0) {
        send_to_char("Mobile has the following speeches defined:\n\r",ch);
        pSVar9 = mob->speech;
        if (pSVar9 != (SPEECH_DATA *)0x0) {
          do {
            sprintf(local_5a38,"%s\n\r",pSVar9->name);
            send_to_char(local_5a38,ch);
            pSVar9 = pSVar9->next;
          } while (pSVar9 != (SPEECH_DATA *)0x0);
        }
        goto LAB_0035f1f8;
      }
      pcVar7 = "Mobile has no speeches defined.\n\r";
    }
  }
  else {
    sort_speech(pSVar8);
    bVar5 = str_prefix(local_4838,"line");
    if (bVar5) {
LAB_0035f1f8:
      if (pSVar8 == (SPEECH_DATA *)0x0) {
        return true;
      }
      sort_speech(pSVar8);
      return true;
    }
    bVar5 = str_prefix(local_2438,"list");
    if (bVar5) {
      bVar5 = str_prefix(local_2438,"add");
      pcVar7 = one_argument(pcVar7,local_5a38);
      if (bVar5) {
        pLVar11 = pSVar8->first_line;
        if (pLVar11 != (LINE_DATA *)0x0) {
          iVar6 = atoi(local_2438);
          do {
            if (pLVar11->number == iVar6) {
              bVar5 = str_cmp(local_5a38,"delete");
              if (!bVar5) {
                operator_delete(pLVar11,0x30);
                pcVar7 = "Deleted.\n\r";
                goto LAB_0035f2a0;
              }
              bVar5 = str_prefix(local_5a38,"delay");
              if (!bVar5) {
                iVar6 = atoi(pcVar7);
                pLVar11->delay = iVar6;
                pcVar7 = "Delay set.\n\r";
                goto LAB_0035f2a0;
              }
              bVar5 = str_prefix(local_5a38,"number");
              if (!bVar5) {
                iVar6 = atoi(pcVar7);
                pLVar11->number = iVar6;
                pcVar7 = "Number set.\n\r";
                goto LAB_0035f2a0;
              }
              bVar5 = str_prefix(local_5a38,"type");
              if (bVar5) {
                bVar5 = str_prefix(local_5a38,"text");
                if (!bVar5) {
                  free_pstring(pLVar11->text);
                  pcVar7 = palloc_string(pcVar7);
                  pLVar11->text = pcVar7;
                  pcVar7 = "Text set.\n\r";
                  goto LAB_0035f2a0;
                }
                pcVar7 = "Not a valid entry.\n\r";
                goto LAB_0035f6ac;
              }
              iVar6 = flag_lookup(pcVar7,speech_table);
              if (iVar6 == -99) goto LAB_0035f53d;
              pLVar11->type = (short)iVar6;
              pcVar7 = "Type set.\n\r";
              goto LAB_0035f2a0;
            }
            pLVar11 = pLVar11->next;
          } while (pLVar11 != (LINE_DATA *)0x0);
        }
        pcVar7 = "Not a valid line number.\n\r";
      }
      else {
        pcVar7 = one_argument(pcVar7,local_1238);
        pLVar11 = new_line_data();
        iVar6 = atoi(local_5a38);
        pLVar11->delay = iVar6;
        iVar6 = flag_lookup(local_1238,speech_table);
        if (iVar6 != -99) {
          pLVar11->type = (short)iVar6;
          pcVar7 = palloc_string(pcVar7);
          pLVar11->text = pcVar7;
          pLVar3 = pSVar8->first_line->next;
          pLVar4 = pSVar8->first_line;
          while (pLVar3 != (LINE_DATA *)0x0) {
            pLVar4->next = pLVar11;
            pLVar4 = pLVar11;
            pLVar3 = pLVar11->next;
          }
          pcVar7 = "Added.\n\r";
          goto LAB_0035f2a0;
        }
LAB_0035f53d:
        pcVar7 = "Not a valid type.\n\r";
      }
    }
    else {
      if (pSVar8->first_line != (LINE_DATA *)0x0) {
        sprintf(local_5a38,"%s Lines:\n\r",pSVar8->name);
        send_to_char(local_5a38,ch);
        pLVar11 = pSVar8->first_line;
        if (pLVar11 != (LINE_DATA *)0x0) {
          do {
            uVar1 = pLVar11->number;
            uVar2 = pLVar11->delay;
            pcVar7 = flag_name_lookup((long)pLVar11->type,speech_table);
            sprintf(local_5a38,"Line #%d: %d %s %s\n\r",(ulong)uVar1,(ulong)uVar2,pcVar7,
                    pLVar11->text);
            send_to_char(local_5a38,ch);
            pLVar11 = pLVar11->next;
          } while (pLVar11 != (LINE_DATA *)0x0);
        }
        goto LAB_0035f1f8;
      }
      pcVar7 = "This speech has no lines.\n\r";
    }
  }
LAB_0035f6ac:
  send_to_char(pcVar7,ch);
  return false;
}

Assistant:

bool medit_speech(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	SPEECH_DATA *speech, *sptr;
	char buf[MSL], cmd[MSL], name[MSL], arg3[MSL], arg4[MSL], arg5[MSL];
	LINE_DATA *lptr, *new_line;
	int type;

	EDIT_MOB(ch, pMobIndex);

	if (!*argument)
	{
		send_to_char("The following speech commands are available:\n\r", ch);
		send_to_char("   speech list\n\r", ch);
		send_to_char("   speech add <speech_name>\n\r", ch);
		send_to_char("   speech del <speech_name>\n\r", ch);
		send_to_char("   speech <speech_name> line add <#delay> <type> <text>\n\r", ch);
		send_to_char("   speech <speech_name> line list\n\r", ch);
		send_to_char("   speech <speech_name> line <#> text <text>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delay <#>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> type <type>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delete\n\r", ch);
		/* list commands */
	}
	else
	{
		argument = one_argument(argument, cmd);
		argument = one_argument(argument, name);
		argument = one_argument(argument, arg3);

		speech = find_speech(pMobIndex, cmd);

		if (speech != nullptr)
		{
			sort_speech(speech);

			if (!str_prefix(name, "line"))
			{
				if (!str_prefix(arg3, "list"))
				{
					if (!speech->first_line)
					{
						send_to_char("This speech has no lines.\n\r", ch);
						return false;
					}

					sprintf(buf, "%s Lines:\n\r", speech->name);
					send_to_char(buf, ch);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						sprintf(buf, "Line #%d: %d %s %s\n\r",
							lptr->number,
							lptr->delay,
							flag_name_lookup(lptr->type, speech_table),
							lptr->text);
						send_to_char(buf, ch);
					}
				}
				else if (!str_prefix(arg3, "add"))
				{
					argument = one_argument(argument, arg4);
					argument = one_argument(argument, arg5);
					new_line = new_line_data();

					new_line->delay = atoi(arg4);
					type = flag_lookup(arg5, speech_table);

					if (type == NO_FLAG)
					{
						send_to_char("Not a valid type.\n\r", ch);
						return false;
					}

					new_line->type = type;
					new_line->text = palloc_string(argument);

					for (lptr = speech->first_line; lptr->next != nullptr; lptr = lptr->next)
					{
						lptr->next = new_line;
					}

					send_to_char("Added.\n\r", ch);
					return true;
				}
				else
				{
					argument = one_argument(argument, arg4);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						if (lptr->number == atoi(arg3))
							break;
					}

					if (!lptr)
					{
						send_to_char("Not a valid line number.\n\r", ch);
						return false;
					}
					else
					{
						if (!str_cmp(arg4, "delete"))
						{
							delete lptr;
							send_to_char("Deleted.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "delay"))
						{
							lptr->delay = atoi(argument);
							send_to_char("Delay set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "number"))
						{
							lptr->number = atoi(argument);
							send_to_char("Number set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "type"))
						{
							type = flag_lookup(argument, speech_table);

							if (type == NO_FLAG)
							{
								send_to_char("Not a valid type.\n\r", ch);
								return false;
							}

							lptr->type = type;
							send_to_char("Type set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "text"))
						{
							free_pstring(lptr->text);
							lptr->text = palloc_string(argument);

							send_to_char("Text set.\n\r", ch);
							return true;
						}
						else
						{
							send_to_char("Not a valid entry.\n\r", ch);
							return false;
						}
					}
				}
			}
		}
		else if (!str_prefix(cmd, "list"))
		{
			if (!pMobIndex->speech)
			{
				send_to_char("Mobile has no speeches defined.\n\r", ch);
				return false;
			}

			send_to_char("Mobile has the following speeches defined:\n\r", ch);

			for (sptr = pMobIndex->speech; sptr; sptr = sptr->next)
			{
				sprintf(buf, "%s\n\r", sptr->name);
				send_to_char(buf, ch);
			}
		}
		else if (!str_prefix(cmd, "add"))
		{
			if (!*name)
			{
				send_to_char("You must specify a name for the new speech.\n\r", ch);
				return false;
			}

			speech = new_speech_data();
			speech->name = palloc_string(name);

			if (!pMobIndex->speech)
			{
				pMobIndex->speech = speech;
			}
			else
			{
				for (sptr = pMobIndex->speech; sptr->next; sptr = sptr->next);
				sptr->next = speech;
				speech->prev = sptr;
			}

			send_to_char("Speech added.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "del"))
		{
			if (!*name)
			{
				send_to_char("Delete which speech?\n\r", ch);
				return false;
			}

			speech = find_speech(pMobIndex, name);

			if (!speech)
			{
				send_to_char("No speech by that name found.\n\r", ch);
				return false;
			}

			free_speech(speech);
			send_to_char("Speech deleted.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "edit"))
		{
			/* blah */
		}
		else
		{
			send_to_char("Invalid speech command.\n\r", ch);
			return false;
		}

		if (speech)
			sort_speech(speech);
	}

	return true;
}